

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_float32_primitive_negated
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  int iVar2;
  sysbvm_object_tuple_t *floatObject;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    iVar2 = *(int *)(uVar1 + 0x10);
  }
  else {
    iVar2 = (int)(uVar1 >> 4);
  }
  return (ulong)(iVar2 + 0x80000000) << 4 | 0xd;
}

Assistant:

static sysbvm_tuple_t sysbvm_float32_primitive_negated(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_float32_t operand = sysbvm_tuple_float32_decode(arguments[0]);
    return sysbvm_tuple_float32_encode(context, -operand);
}